

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

void __thiscall Lib::Deque<Kernel::Clause_*>::~Deque(Deque<Kernel::Clause_*> *this)

{
  long in_RDI;
  Clause **p;
  undefined8 local_10;
  
  for (local_10 = *(long *)(in_RDI + 0x18); local_10 != *(long *)(in_RDI + 0x10);
      local_10 = local_10 + -8) {
    if (local_10 == *(long *)(in_RDI + 8)) {
      local_10 = *(long *)(in_RDI + 0x20);
    }
  }
  Lib::free(*(void **)(in_RDI + 8));
  return;
}

Assistant:

inline ~Deque()
  {
    C* p=_back;
    while(p!=_front) {
      if(p==_data) {
	p=_end;
      }
      (--p)->~C();
    }
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");
  }